

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O3

PseudoDataLoc *
yactfr::internal::anon_unknown_2::pseudoDataLocOfDynDt
          (PseudoDataLoc *__return_storage_ptr__,JsonObjVal *jsonDt,string *propName)

{
  pointer puVar1;
  int iVar2;
  JsonVal *pJVar3;
  JsonObjVal *pJVar4;
  JsonStrVal *pJVar5;
  JsonArrayVal *pJVar6;
  PseudoDataLoc *extraout_RAX;
  unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
  *jsonPathElem;
  pointer puVar7;
  byte bVar8;
  ScalarValItemMixin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar9;
  ulong uVar10;
  PathElems pathElems;
  ulong in_stack_ffffffffffffff60;
  pointer poVar11;
  pointer poVar12;
  string local_68;
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  pJVar3 = MapItemMixin<yactfr::internal::JsonVal>::_tryAt
                     (&jsonDt->super_MapItemMixin<yactfr::internal::JsonVal>,propName);
  pJVar4 = JsonVal::asObj(pJVar3);
  std::__cxx11::string::string((string *)&local_68,"origin",(allocator *)&stack0xffffffffffffff68);
  pJVar3 = MapItemMixin<yactfr::internal::JsonVal>::_tryAt
                     (&pJVar4->super_MapItemMixin<yactfr::internal::JsonVal>,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (pJVar3 == (JsonVal *)0x0) {
    uVar10 = 0;
    bVar8 = 0;
  }
  else {
    pJVar5 = JsonVal::asStr_abi_cxx11_(pJVar3);
    pSVar9 = &pJVar5->
              super_ScalarValItemMixin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ;
    iVar2 = std::__cxx11::string::compare((char *)pSVar9);
    bVar8 = 1;
    if (iVar2 == 0) {
      uVar10 = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)pSVar9);
      if (iVar2 == 0) {
        uVar10 = 0x100000000;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)pSVar9);
        if (iVar2 == 0) {
          uVar10 = 0x200000000;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)pSVar9);
          if (iVar2 == 0) {
            uVar10 = 0x300000000;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)pSVar9);
            if (iVar2 == 0) {
              uVar10 = 0x400000000;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)pSVar9);
              if (iVar2 != 0) {
                __assert_fail("scopeName == strs::erPayload",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/pseudo-dt-erector.cpp"
                              ,0x139,
                              "auto yactfr::internal::(anonymous namespace)::pseudoDataLocOfDynDt(const JsonObjVal &, const std::string &)::(anonymous class)::operator()()::(anonymous class)::operator()() const"
                             );
              }
              uVar10 = 0x500000000;
            }
          }
        }
      }
    }
  }
  poVar11 = (pointer)0x0;
  poVar12 = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_68,"path",(allocator *)&stack0xffffffffffffff67);
  pJVar3 = MapItemMixin<yactfr::internal::JsonVal>::_tryAt
                     (&pJVar4->super_MapItemMixin<yactfr::internal::JsonVal>,&local_68);
  pJVar6 = JsonVal::asArray(pJVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  puVar7 = (pJVar6->super_ArrayItemMixin<yactfr::internal::JsonVal>).
           super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
           ._theItems.
           super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pJVar6->super_ArrayItemMixin<yactfr::internal::JsonVal>).
           super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
           ._theItems.
           super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      pJVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
               .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
      if ((pJVar3->super_ItemMixin<yactfr::internal::JsonValKind>)._theKind == Null) {
        if (poVar12 == (pointer)0x0) {
          std::
          vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
          ::_M_realloc_insert<boost::none_t_const&>
                    ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                      *)&stack0xffffffffffffff68,(iterator)0x0,(none_t *)&boost::none);
        }
        else {
          (poVar12->super_type).m_initialized = false;
          poVar12 = poVar12 + 1;
        }
      }
      else {
        pJVar5 = JsonVal::asStr_abi_cxx11_(pJVar3);
        std::
        vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string_const&>
                  ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                    *)&stack0xffffffffffffff68,
                   &(pJVar5->
                    super_ScalarValItemMixin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )._theVal);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  local_48.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = poVar11;
  local_48.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar12;
  PseudoDataLoc::PseudoDataLoc
            (__return_storage_ptr__,(uint)(bVar8 ^ 1) * 2 + Abs,
             (optional<yactfr::Scope>)(uVar10 | bVar8),(PathElems)(pJVar4->super_JsonVal)._loc,
             (TextLocation)ZEXT824(in_stack_ffffffffffffff60));
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffff68);
  return extraout_RAX;
}

Assistant:

PseudoDataLoc pseudoDataLocOfDynDt(const JsonObjVal& jsonDt, const std::string& propName)
{
    auto& jsonLocVal = jsonDt[propName]->asObj();

    const auto scope = call([&jsonLocVal]() -> boost::optional<Scope> {
        if (const auto jsonOrigVal = jsonLocVal[strs::orig]) {
            // absolute
            return call([jsonOrigVal] {
                auto& scopeName = *jsonOrigVal->asStr();

                if (scopeName == strs::pktHeader) {
                    return Scope::PacketHeader;
                } else if (scopeName == strs::pktCtx) {
                    return Scope::PacketContext;
                } else if (scopeName == strs::erHeader) {
                    return Scope::EventRecordHeader;
                } else if (scopeName == strs::erCommonCtx) {
                    return Scope::EventRecordCommonContext;
                } else if (scopeName == strs::erSpecCtx) {
                    return Scope::EventRecordSpecificContext;
                } else {
                    assert(scopeName == strs::erPayload);
                    return Scope::EventRecordPayload;
                }
            });
        }

        // relative
        return boost::none;
    });

    PseudoDataLoc::PathElems pathElems;

    {
        auto& jsonPathVal = jsonLocVal[strs::path]->asArray();

        for (auto& jsonPathElem : jsonPathVal) {
            if (jsonPathElem->isNull()) {
                pathElems.emplace_back(boost::none);
            } else {
                pathElems.emplace_back(*jsonPathElem->asStr());
            }
        }
    }

    return PseudoDataLoc {
        scope ? PseudoDataLoc::Kind::Abs : PseudoDataLoc::Kind::Rel2,
        scope, std::move(pathElems), jsonLocVal.loc()
    };
}